

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

object * jessilib::deserialize_object
                   (object *__return_storage_ptr__,istream *in_stream,string *in_format,
                   text_encoding in_encoding)

{
  long *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  get_parser((jessilib *)&local_30,in_format);
  (**(code **)(*local_30 + 0x10))(__return_storage_ptr__,local_30,in_stream,in_encoding);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  return __return_storage_ptr__;
}

Assistant:

object deserialize_object(std::istream& in_stream, const std::string& in_format, text_encoding in_encoding) {
	return get_parser(in_format)->deserialize_bytes(in_stream, in_encoding);
}